

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O1

void helicsTranslatorAddDestinationEndpoint(HelicsTranslator trans,char *ept,HelicsError *err)

{
  Translator *this;
  size_t sVar1;
  string_view newTarget;
  
  this = getTranslator(trans,err);
  if (this != (Translator *)0x0) {
    if (ept == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar1 = strlen(ept);
      newTarget._M_str = ept;
      newTarget._M_len = sVar1;
      helics::Interface::addDestinationTarget(&this->super_Interface,newTarget,ENDPOINT);
    }
  }
  return;
}

Assistant:

void helicsTranslatorAddDestinationEndpoint(HelicsTranslator trans, const char* ept, HelicsError* err)
{
    auto* translator = getTranslator(trans, err);
    if (translator == nullptr) {
        return;
    }
    CHECK_NULL_STRING(ept, void());
    try {
        translator->addDestinationEndpoint(ept);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}